

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void BuildHistograms(uint8_t *input,size_t start_pos,size_t mask,Command_conflict *commands,
                    size_t n_commands,HistogramLiteral *lit_histo,HistogramCommand *cmd_histo,
                    HistogramDistance *dist_histo)

{
  ulong uVar1;
  ulong uVar2;
  Command_conflict *pCVar3;
  ulong uVar4;
  ulong local_a0;
  size_t j;
  Command_conflict cmd;
  size_t i;
  size_t pos;
  HistogramLiteral *lit_histo_local;
  size_t n_commands_local;
  Command_conflict *commands_local;
  size_t mask_local;
  size_t start_pos_local;
  uint8_t *input_local;
  
  cmd.dist_extra_ = 0;
  cmd.cmd_prefix_ = 0;
  cmd.dist_prefix_ = 0;
  i = start_pos;
  for (; (ulong)cmd._8_8_ < n_commands; cmd._8_8_ = cmd._8_8_ + 1) {
    pCVar3 = commands + cmd._8_8_;
    uVar1._0_4_ = pCVar3->insert_len_;
    uVar1._4_4_ = pCVar3->copy_len_;
    uVar2._0_4_ = pCVar3->dist_extra_;
    uVar2._4_2_ = pCVar3->cmd_prefix_;
    uVar2._6_2_ = pCVar3->dist_prefix_;
    uVar4 = uVar2 >> 0x20 & 0xffff;
    cmd_histo->data_[uVar4] = cmd_histo->data_[uVar4] + 1;
    cmd_histo->total_count_ = cmd_histo->total_count_ + 1;
    for (local_a0 = uVar1 & 0xffffffff; local_a0 != 0; local_a0 = local_a0 - 1) {
      lit_histo->data_[input[i & mask]] = lit_histo->data_[input[i & mask]] + 1;
      lit_histo->total_count_ = lit_histo->total_count_ + 1;
      i = i + 1;
    }
    i = (uVar1._4_4_ & 0x1ffffff) + i;
    if (((uVar1 & 0x1ffffff00000000) != 0) && (0x7f < (ushort)uVar2._4_2_)) {
      dist_histo->data_[(int)((ushort)uVar2._6_2_ & 0x3ff)] =
           dist_histo->data_[(int)((ushort)uVar2._6_2_ & 0x3ff)] + 1;
      dist_histo->total_count_ = dist_histo->total_count_ + 1;
    }
  }
  return;
}

Assistant:

static void BuildHistograms(const uint8_t* input,
                            size_t start_pos,
                            size_t mask,
                            const Command* commands,
                            size_t n_commands,
                            HistogramLiteral* lit_histo,
                            HistogramCommand* cmd_histo,
                            HistogramDistance* dist_histo) {
  size_t pos = start_pos;
  size_t i;
  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    size_t j;
    HistogramAddCommand(cmd_histo, cmd.cmd_prefix_);
    for (j = cmd.insert_len_; j != 0; --j) {
      HistogramAddLiteral(lit_histo, input[pos & mask]);
      ++pos;
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd) && cmd.cmd_prefix_ >= 128) {
      HistogramAddDistance(dist_histo, cmd.dist_prefix_ & 0x3FF);
    }
  }
}